

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O0

void af_glyph_hints_align_weak_points(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Point_conflict pAVar1;
  AF_Point_conflict p1;
  AF_Point_conflict p2;
  AF_Point_conflict p2_00;
  ushort uVar2;
  AF_Point_conflict ref2;
  AF_Point_conflict ref1;
  AF_Point_conflict pAVar3;
  AF_Point_conflict *ppAVar4;
  bool bVar5;
  AF_Point_conflict last_touched;
  AF_Point_conflict first_touched;
  AF_Point_conflict first_point;
  AF_Point_conflict end_point;
  AF_Point_conflict point;
  FT_UInt touch_flag;
  AF_Point_conflict *contour_limit;
  AF_Point_conflict *contour;
  AF_Point_conflict point_limit;
  AF_Point_conflict points;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  pAVar1 = hints->points;
  pAVar3 = pAVar1 + hints->num_points;
  contour_limit = hints->contours;
  ppAVar4 = contour_limit + hints->num_contours;
  end_point = pAVar1;
  if (dim == AF_DIMENSION_HORZ) {
    uVar2 = 4;
    for (; end_point < pAVar3; end_point = end_point + 1) {
      end_point->u = end_point->x;
      end_point->v = end_point->ox;
    }
  }
  else {
    uVar2 = 8;
    for (; end_point < pAVar3; end_point = end_point + 1) {
      end_point->u = end_point->y;
      end_point->v = end_point->oy;
    }
  }
  do {
    if (ppAVar4 <= contour_limit) {
      end_point = pAVar1;
      if (dim == AF_DIMENSION_HORZ) {
        for (; end_point < pAVar3; end_point = end_point + 1) {
          end_point->x = end_point->u;
        }
      }
      else {
        for (; end_point < pAVar3; end_point = end_point + 1) {
          end_point->y = end_point->u;
        }
      }
      return;
    }
    p1 = *contour_limit;
    p2 = p1->prev;
    for (end_point = p1; ref2 = end_point, end_point <= p2; end_point = end_point + 1) {
      if ((end_point->flags & uVar2) != 0) {
        do {
          while( true ) {
            ref1 = end_point;
            bVar5 = false;
            if (end_point < p2) {
              bVar5 = (end_point[1].flags & uVar2) != 0;
            }
            if (!bVar5) break;
            end_point = end_point + 1;
          }
          do {
            p2_00 = end_point;
            end_point = p2_00 + 1;
            if (p2 < end_point) {
              if (ref1 == ref2) {
                af_iup_shift(p1,p2,ref2);
              }
              else {
                if (ref1 < p2) {
                  af_iup_interp(ref1 + 1,p2,ref1,ref2);
                }
                if (pAVar1 < ref2) {
                  af_iup_interp(p1,ref2 + -1,ref1,ref2);
                }
              }
              goto LAB_0035c87c;
            }
          } while ((end_point->flags & uVar2) == 0);
          af_iup_interp(ref1 + 1,p2_00,ref1,end_point);
        } while( true );
      }
    }
LAB_0035c87c:
    contour_limit = contour_limit + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_weak_points( AF_GlyphHints  hints,
                                    AF_Dimension   dim )
  {
    AF_Point   points        = hints->points;
    AF_Point   point_limit   = points + hints->num_points;
    AF_Point*  contour       = hints->contours;
    AF_Point*  contour_limit = contour + hints->num_contours;
    FT_UInt    touch_flag;
    AF_Point   point;
    AF_Point   end_point;
    AF_Point   first_point;


    /* PASS 1: Move segment points to edge positions */

    if ( dim == AF_DIMENSION_HORZ )
    {
      touch_flag = AF_FLAG_TOUCH_X;

      for ( point = points; point < point_limit; point++ )
      {
        point->u = point->x;
        point->v = point->ox;
      }
    }
    else
    {
      touch_flag = AF_FLAG_TOUCH_Y;

      for ( point = points; point < point_limit; point++ )
      {
        point->u = point->y;
        point->v = point->oy;
      }
    }

    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  first_touched, last_touched;


      point       = *contour;
      end_point   = point->prev;
      first_point = point;

      /* find first touched point */
      for (;;)
      {
        if ( point > end_point )  /* no touched point in contour */
          goto NextContour;

        if ( point->flags & touch_flag )
          break;

        point++;
      }

      first_touched = point;

      for (;;)
      {
        FT_ASSERT( point <= end_point                 &&
                   ( point->flags & touch_flag ) != 0 );

        /* skip any touched neighbours */
        while ( point < end_point                    &&
                ( point[1].flags & touch_flag ) != 0 )
          point++;

        last_touched = point;

        /* find the next touched point, if any */
        point++;
        for (;;)
        {
          if ( point > end_point )
            goto EndContour;

          if ( ( point->flags & touch_flag ) != 0 )
            break;

          point++;
        }

        /* interpolate between last_touched and point */
        af_iup_interp( last_touched + 1, point - 1,
                       last_touched, point );
      }

    EndContour:
      /* special case: only one point was touched */
      if ( last_touched == first_touched )
        af_iup_shift( first_point, end_point, first_touched );

      else /* interpolate the last part */
      {
        if ( last_touched < end_point )
          af_iup_interp( last_touched + 1, end_point,
                         last_touched, first_touched );

        if ( first_touched > points )
          af_iup_interp( first_point, first_touched - 1,
                         last_touched, first_touched );
      }

    NextContour:
      ;
    }

    /* now save the interpolated values back to x/y */
    if ( dim == AF_DIMENSION_HORZ )
    {
      for ( point = points; point < point_limit; point++ )
        point->x = point->u;
    }
    else
    {
      for ( point = points; point < point_limit; point++ )
        point->y = point->u;
    }
  }